

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniform16(Instruction *instruction)

{
  IRContext *pIVar1;
  DefUseManager *this;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  uint32_t uVar9;
  _Elt_pointer puVar10;
  Instruction *this_00;
  ulong uVar11;
  uint **ppuVar12;
  _Optional_payload_base<spv::Capability> _Var13;
  uint uVar14;
  FeatureManager *feature_manager;
  pointer pOVar15;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **local_d8;
  undefined8 local_d0;
  code *local_c8;
  code *local_c0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  DecorationManager *local_60;
  uint *local_58;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  if (instruction->opcode_ != OpTypePointer) {
    __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0xf7,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniform16(const Instruction *)"
                 );
  }
  uVar9 = (instruction->has_result_id_ & 1) + 1;
  if (instruction->has_type_id_ == false) {
    uVar9 = (uint)instruction->has_result_id_;
  }
  uVar9 = Instruction::GetSingleWordOperand(instruction,uVar9);
  _Var13._M_payload = (_Storage<spv::Capability,_true>)0x1152;
  _Var13._M_engaged = false;
  _Var13._5_3_ = 0;
  if (uVar9 == 2) {
    pIVar1 = instruction->context_;
    feature_manager =
         (pIVar1->feature_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
         .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (feature_manager == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      feature_manager =
           (pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar6 = anon_unknown_0::Has16BitCapability(feature_manager);
    if (bVar6) {
      bVar6 = EnumSet<spv::Capability>::contains
                        (&feature_manager->capabilities_,CapabilityStorageBuffer16BitAccess);
      pIVar1 = instruction->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      local_60 = (pIVar1->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
      uVar9 = 0;
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_b8,0);
      if (instruction->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(instruction,(uint)instruction->has_type_id_);
      }
      local_d8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                 CONCAT44(local_d8._4_4_,uVar9);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,(uint *)&local_d8);
      pIVar1 = instruction->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_b8);
      }
      else {
        this = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
        bVar5 = false;
        do {
          puVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          this_00 = analysis::DefUseManager::GetDef(this,puVar10[-1]);
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar4 = bVar5;
          if (!bVar5) {
            if (bVar6) {
              uVar9 = 0;
              if (this_00->has_result_id_ == true) {
                uVar9 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
              }
              bVar7 = analysis::DecorationManager::HasDecoration(local_60,uVar9,BufferBlock);
              if (bVar7) goto LAB_005411f0;
            }
            bVar7 = anon_unknown_0::is16bitType(this_00);
            bVar4 = true;
            if ((!bVar7) && (uVar11 = (ulong)this_00->opcode_, bVar4 = bVar5, uVar11 < 0x21)) {
              if ((0x31800000UL >> (uVar11 & 0x3f) & 1) == 0) {
                if (uVar11 == 0x1e) {
                  local_48 = 0;
                  local_50 = &local_b8;
                  local_38 = std::
                             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                             ::_M_invoke;
                  local_40 = std::
                             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                             ::_M_manager;
                  local_d0 = 0;
                  local_d8 = &local_50;
                  local_c0 = std::
                             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                             ::_M_invoke;
                  local_c8 = std::
                             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                             ::_M_manager;
                  pOVar15 = (this_00->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pOVar2 = (this_00->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (pOVar15 == pOVar2) {
LAB_005412eb:
                    (*local_c8)(&local_d8,&local_d8,3);
                  }
                  else {
                    do {
                      if ((pOVar15->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                        ppuVar3 = (uint **)(pOVar15->words).large_data_._M_t.
                                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                           ._M_head_impl;
                        ppuVar12 = &(pOVar15->words).small_data_;
                        if (ppuVar3 != (uint **)0x0) {
                          ppuVar12 = ppuVar3;
                        }
                        local_58 = *ppuVar12;
                        if (local_c8 == (code *)0x0) {
                          std::__throw_bad_function_call();
                        }
                        cVar8 = (*local_c0)(&local_d8,&local_58);
                        if (cVar8 == '\0') break;
                      }
                      pOVar15 = pOVar15 + 1;
                    } while (pOVar15 != pOVar2);
                    if (local_c8 != (code *)0x0) goto LAB_005412eb;
                  }
                  if (local_40 != (code *)0x0) {
                    (*local_40)(&local_50,&local_50,3);
                  }
                  goto LAB_005411f0;
                }
                if (uVar11 != 0x20) goto LAB_005411f0;
                uVar14 = (this_00->has_result_id_ & 1) + 1;
                if (this_00->has_type_id_ == false) {
                  uVar14 = (uint)this_00->has_result_id_;
                }
                uVar9 = uVar14 + 1;
              }
              else {
                uVar9 = (this_00->has_result_id_ & 1) + 1;
                if (this_00->has_type_id_ == false) {
                  uVar9 = (uint)this_00->has_result_id_;
                }
              }
              uVar9 = Instruction::GetSingleWordOperand(this_00,uVar9);
              local_d8 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                         CONCAT44(local_d8._4_4_,uVar9);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
                         (uint *)&local_d8);
            }
          }
LAB_005411f0:
          bVar5 = bVar4;
        } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_b8);
        if (bVar4) {
          _Var13._M_payload = (_Storage<spv::Capability,_true>)0x1152;
          _Var13._M_engaged = true;
          _Var13._5_3_ = 0;
        }
      }
    }
  }
  return (optional<spv::Capability>)_Var13;
}

Assistant:

static std::optional<spv::Capability> Handler_OpTypePointer_StorageUniform16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  const auto* feature_manager = instruction->context()->get_feature_mgr();
  if (!Has16BitCapability(feature_manager)) {
    return std::nullopt;
  }

  const bool hasBufferBlockCapability =
      feature_manager->GetCapabilities().contains(
          spv::Capability::StorageUniformBufferBlock16);
  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  bool found16bitType = false;

  DFSWhile(instruction, [decoration_mgr, hasBufferBlockCapability,
                         &found16bitType](const Instruction* item) {
    if (found16bitType) {
      return false;
    }

    if (hasBufferBlockCapability &&
        decoration_mgr->HasDecoration(item->result_id(),
                                      spv::Decoration::BufferBlock)) {
      return false;
    }

    if (is16bitType(item)) {
      found16bitType = true;
      return false;
    }

    return true;
  });

  return found16bitType ? std::optional(spv::Capability::StorageUniform16)
                        : std::nullopt;
}